

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_buffer__adjust_quic_blocksize(ptls_buffer_t *buf,size_t body_size)

{
  int iVar1;
  uint8_t *puVar2;
  ptls_buffer_t *buf_00;
  size_t in_RSI;
  long *in_RDI;
  int ret;
  size_t sizelen;
  uint8_t sizebuf [8];
  uint64_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined1 local_20 [8];
  size_t local_18;
  long *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  puVar2 = ptls_encode_quicint((uint8_t *)
                               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                               in_stack_ffffffffffffffc8);
  buf_00 = (ptls_buffer_t *)(puVar2 + -(long)local_20);
  if (buf_00 != (ptls_buffer_t *)0x1) {
    iVar1 = ptls_buffer_reserve(buf_00,CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                               );
    if (iVar1 != 0) {
      return iVar1;
    }
    memmove((void *)(((*local_10 + local_10[2]) - local_18) + -1 + (long)buf_00),
            (void *)((*local_10 + local_10[2]) - local_18),local_18);
    local_10[2] = (long)buf_00 + local_10[2] + -1;
  }
  memcpy((void *)(((*local_10 + local_10[2]) - local_18) - (long)buf_00),local_20,(size_t)buf_00);
  return 0;
}

Assistant:

int ptls_buffer__adjust_quic_blocksize(ptls_buffer_t *buf, size_t body_size)
{
    uint8_t sizebuf[PTLS_ENCODE_QUICINT_CAPACITY];
    size_t sizelen = ptls_encode_quicint(sizebuf, body_size) - sizebuf;

    /* adjust amount of space before body_size to `sizelen` bytes */
    if (sizelen != 1) {
        int ret;
        if ((ret = ptls_buffer_reserve(buf, sizelen - 1)) != 0)
            return ret;
        memmove(buf->base + buf->off - body_size - 1 + sizelen, buf->base + buf->off - body_size, body_size);
        buf->off += sizelen - 1;
    }

    /* write the size */
    memcpy(buf->base + buf->off - body_size - sizelen, sizebuf, sizelen);

    return 0;
}